

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::PathTypeSuccessorKey,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::PathTypeSuccessorKey,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<Js::PathTypeSuccessorKey,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>
           *this,PathTypeSuccessorKey *key,RecyclerWeakReference<Js::DynamicType> **value)

{
  BaseDictionary<Js::PathTypeSuccessorKey,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  char *pcVar2;
  RecyclerWeakReference<Js::DynamicType> *pRVar3;
  long lVar4;
  code *pcVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  undefined4 *puVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  hash_t hashCode;
  RecyclerWeakReference<Js::DynamicType> *local_60;
  PathTypeSuccessorKey *local_58;
  char *local_50;
  RecyclerWeakReference<Js::DynamicType> *local_48;
  uint local_3c;
  RecyclerWeakReference<Js::DynamicType> **local_38;
  
  lVar10 = *(long *)this;
  local_38 = value;
  if (lVar10 == 0) {
    BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar10 = *(long *)this;
  }
  hashCode = key->propertyId * 0x200 + (uint)key->attributes * 2 + 1;
  local_3c = BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar12 = *(uint *)(lVar10 + (ulong)local_3c * 4);
  local_58 = key;
  if ((int)uVar12 < 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    do {
      pcVar2 = (char *)(*(long *)(this + 8) + (ulong)uVar12 * 0x18);
      if ((*(int *)(pcVar2 + 0xc) == key->propertyId) &&
         (*(Type *)(*(long *)(this + 8) + 0x10 + (ulong)uVar12 * 0x18) == key->attributes)) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar11);
        }
        pRVar3 = *local_38;
        Memory::Recycler::WBSetBit((char *)&local_60);
        local_60 = pRVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
        pRVar3 = local_60;
        Memory::Recycler::WBSetBit(pcVar2);
        *(RecyclerWeakReference<Js::DynamicType> **)pcVar2 = pRVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar2);
        return uVar12;
      }
      uVar11 = uVar11 + 1;
      uVar12 = *(uint *)(pcVar2 + 8);
    } while (-1 < (int)uVar12);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar11);
  }
  iVar8 = *(int *)(this + 0x28);
  if (iVar8 == 0) {
    if (*(int *)(this + 0x20) == *(int *)(this + 0x18)) {
      MapAndRemoveIf<JsUtil::BaseDictionary<Js::PathTypeSuccessorKey,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>::Insert<(JsUtil::BaseDictionary<Js::PathTypeSuccessorKey,Memory::RecyclerWeakReference<Js::DynamicType>*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,DefaultComparer,JsUtil::WeakRefValueDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>(Js::PathTypeSuccessorKey_const&,Memory::RecyclerWeakReference<Js::DynamicType>*const&)::_lambda(JsUtil::WeakRefValueDictionaryEntry<Js::PathTypeSuccessorKey,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>>&)_1_>
                (this);
      iVar8 = *(int *)(this + 0x28);
      if (iVar8 != 0) goto LAB_00dcad6f;
    }
    iVar8 = *(int *)(this + 0x18);
    iVar13 = *(int *)(this + 0x20);
    if (iVar13 == iVar8) {
      BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      local_3c = BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
      iVar8 = *(int *)(this + 0x18);
      iVar13 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar13 + 1;
    if (iVar8 < iVar13 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar7) goto LAB_00dcb0d8;
      *puVar9 = 0;
      iVar8 = *(int *)(this + 0x18);
    }
    if (iVar8 <= iVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar7) goto LAB_00dcb0d8;
      *puVar9 = 0;
    }
  }
  else {
LAB_00dcad6f:
    if (iVar8 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar7) goto LAB_00dcb0d8;
      *puVar9 = 0;
    }
    iVar13 = *(int *)(this + 0x24);
    if (iVar13 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar7) goto LAB_00dcb0d8;
      *puVar9 = 0;
      iVar13 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar7) {
LAB_00dcb0d8:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar9 = 0;
      iVar13 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar8 = BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)iVar13 * 0x18 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar8;
    }
  }
  lVar10 = *(long *)(this + 8);
  lVar6 = (long)iVar13 * 0x18;
  local_50 = (char *)(lVar10 + lVar6);
  local_48 = *local_38;
  local_38 = (RecyclerWeakReference<Js::DynamicType> **)(long)iVar13;
  Memory::Recycler::WBSetBit((char *)&local_60);
  local_60 = local_48;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
  pcVar2 = local_50;
  local_48 = local_60;
  Memory::Recycler::WBSetBit(local_50);
  *(RecyclerWeakReference<Js::DynamicType> **)(lVar10 + lVar6) = local_48;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar2);
  *(Type *)(lVar10 + 0x10 + lVar6) = local_58->attributes;
  *(Type *)(lVar10 + 0xc + lVar6) = local_58->propertyId;
  lVar10 = *(long *)this;
  lVar4 = *(long *)(this + 8);
  *(undefined4 *)(lVar4 + 8 + lVar6) = *(undefined4 *)(lVar10 + (ulong)local_3c * 4);
  *(int *)(lVar10 + (ulong)local_3c * 4) = (int)local_38;
  uVar11 = 0;
  iVar8 = iVar13;
  do {
    iVar8 = *(int *)(lVar4 + 8 + (long)iVar8 * 0x18);
    uVar11 = uVar11 + 1;
  } while (iVar8 != -1);
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar11);
  }
  return iVar13;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }